

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrpLineAndFile.hpp
# Opt level: O0

void __thiscall GrpLineAndFile::GrpLineAndFile(GrpLineAndFile *this,GrpLineAndFile *lnf)

{
  undefined4 *in_RSI;
  undefined4 *in_RDI;
  
  std::__cxx11::string::string((string *)(in_RDI + 2));
  *in_RDI = *in_RSI;
  in_RDI[1] = in_RSI[1];
  std::__cxx11::string::operator=((string *)(in_RDI + 2),(string *)(in_RSI + 2));
  return;
}

Assistant:

GrpLineAndFile(const GrpLineAndFile & lnf)
	{
		m_nLinePre = lnf.m_nLinePre;
		m_nLineOrig = lnf.m_nLineOrig;
		m_staFile = lnf.m_staFile;
	}